

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::substring::
     mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  char *pcVar1;
  reference rhs;
  iterator last_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  reference lhs;
  iterator last_01;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  _Elt_pointer psVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  BitmapArray<long> *pBVar8;
  long lVar9;
  BitmapArray<long> *pBVar10;
  char cVar11;
  pos_type pVar12;
  long n;
  long lVar13;
  pos_type pVar14;
  iterator last_02;
  iterator first2;
  iterator last_03;
  iterator last_04;
  iterator PA_00;
  iterator PA_01;
  iterator PA_02;
  iterator iVar15;
  char *pcVar16;
  BitmapArray<long> *pBVar17;
  pos_type pVar18;
  value_type local_118;
  iterator a;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_f0;
  pos_type local_c0;
  BitmapArray<long> *local_b8;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
  *local_b0;
  iterator c;
  BitmapArray<long> *local_90;
  
  pBVar8 = PA.array_;
  local_118 = depth;
  a = (iterator)ZEXT816(0);
  c.array_ = (BitmapArray<long> *)0x0;
  c.pos_ = 0;
  iVar4 = helper::lg<long>(last.pos_ - first.pos_);
  pVar12 = PA.pos_;
  local_c0 = PA.pos_;
  local_b0 = (deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
              *)stack;
LAB_00108489:
  do {
    while( true ) {
      pVar14 = first.pos_;
      pBVar10 = first.array_;
      lVar9 = last.pos_ - pVar14;
      if (8 < lVar9) break;
      if (1 < lVar9) {
        last_00.pos_ = last.pos_;
        last_00.array_ = last.array_;
        PA_00.pos_ = pVar12;
        PA_00.array_ = pBVar8;
        insertionsort<char*,bitmap::BitmapArray<long>::iterator>(T,PA_00,first,last_00,local_118);
      }
      psVar7 = *(_Elt_pointer *)((long)stack + 0x30);
      if (psVar7 == *(_Elt_pointer *)((long)stack + 0x10)) {
        return;
      }
      if (psVar7 == *(_Elt_pointer *)((long)stack + 0x38)) {
        psVar7 = (*(_Map_pointer *)((long)stack + 0x48))[-1] + 10;
      }
      first = psVar7[-1].m_a;
      last.array_ = psVar7[-1].m_b.array_;
      last.pos_ = psVar7[-1].m_b.pos_;
      local_118 = psVar7[-1].m_c;
      iVar4 = psVar7[-1].m_d;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
      ::pop_back(&stack->c);
    }
    pcVar1 = T + local_118;
    iVar5 = iVar4 + -1;
    if (iVar4 == 0) {
      Td.m_PA.array_ = pBVar8;
      Td.m_Td = pcVar1;
      Td.m_PA.pos_ = pVar12;
      helper::
      heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                (Td,first,lVar9);
    }
    else if (0 < iVar4) {
      Td_00.m_PA.array_ = pBVar8;
      Td_00.m_Td = pcVar1;
      Td_00.m_PA.pos_ = pVar12;
      last_02.pos_ = last.pos_;
      last_02.array_ = last.array_;
      pcVar16 = pcVar1;
      pBVar17 = pBVar8;
      pVar18 = pVar12;
      a = helper::
          pivot<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                    (Td_00,first,last_02);
      lhs.pos_ = pVar18;
      lhs.array_ = pBVar17;
      rhs.pos_ = (pos_type)pcVar16;
      rhs.array_ = (BitmapArray<long> *)0x1085f2;
      bitmap::swap(lhs,rhs);
      local_b8 = (BitmapArray<long> *)last.pos_;
      iVar6 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,pVar14);
      iVar6 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar8,CONCAT44(extraout_var,iVar6) + pVar12);
      Td_01.m_PA.array_ = pBVar8;
      Td_01.m_Td = pcVar1;
      Td_01.m_PA.pos_ = pVar12;
      first2.pos_ = pVar14 + 1;
      first2.array_ = pBVar10;
      last_03.pos_ = (pos_type)local_b8;
      last_03.array_ = last.array_;
      bVar3 = helper::
              partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                        (Td_01,first,first2,last_03,&a,&c,pcVar1 + CONCAT44(extraout_var_00,iVar6));
      if (bVar3) {
        iVar4 = (*((a.array_)->super_Bitmap)._vptr_Bitmap[5])(a.array_,a.pos_);
        iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                          (pBVar8,CONCAT44(extraout_var_01,iVar4) + pVar12);
        cVar11 = pcVar1[CONCAT44(extraout_var_02,iVar4)];
        iVar4 = (*((a.array_)->super_Bitmap)._vptr_Bitmap[5])(a.array_,a.pos_);
        iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                          (pBVar8,CONCAT44(extraout_var_03,iVar4) + pVar12);
        iVar15 = a;
        if (pcVar1[CONCAT44(extraout_var_04,iVar4) + -1] < cVar11) {
          last_01.pos_ = c.pos_;
          last_01.array_ = c.array_;
          PA_01.pos_ = pVar12;
          PA_01.array_ = pBVar8;
          iVar15 = partition<bitmap::BitmapArray<long>::iterator>(PA_01,a,last_01,local_118);
        }
        pVar12 = c.pos_;
        stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                 *)local_b0;
        pBVar10 = (BitmapArray<long> *)iVar15.pos_;
        local_90 = iVar15.array_;
        lVar9 = a.pos_ - pVar14;
        lVar13 = last.pos_ - c.pos_;
        n = c.pos_ - (long)pBVar10;
        local_b8 = pBVar10;
        iVar4 = iVar5;
        if (lVar13 < lVar9) {
          if (lVar9 <= n) {
            local_b8 = c.array_;
            local_f0.m_d = helper::lg<long>(n);
            stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                     *)local_b0;
            local_f0.m_b.array_ = local_b8;
            local_f0.m_b.pos_ = pVar12;
            local_f0.m_a = iVar15;
            local_f0.m_c = local_118 + 1;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_b0,&local_f0);
            local_f0.m_b.array_ = a.array_;
            local_f0.m_b.pos_ = a.pos_;
            local_f0.m_c = local_118;
            local_f0.m_a = first;
            local_f0.m_d = iVar5;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                        *)stack,&local_f0);
            first.pos_ = c.pos_;
            first.array_ = c.array_;
            pVar12 = local_c0;
            goto LAB_00108489;
          }
          local_f0.m_b.pos_ = a.pos_;
          if (lVar13 <= n) {
            local_f0.m_b.array_ = a.array_;
            local_f0.m_c = local_118;
            local_f0.m_a = first;
            local_f0.m_d = iVar5;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_b0,&local_f0);
            pVar12 = c.pos_;
            pBVar17 = c.array_;
            pBVar10 = local_b8;
            local_f0.m_d = helper::lg<long>(c.pos_ - (long)local_b8);
            local_f0.m_a.pos_ = (pos_type)pBVar10;
            local_f0.m_a.array_ = local_90;
            local_f0.m_b.array_ = pBVar17;
            local_f0.m_b.pos_ = pVar12;
            local_f0.m_c = local_118 + 1;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                        *)stack,&local_f0);
            first.pos_ = c.pos_;
            first.array_ = c.array_;
            pVar12 = local_c0;
            goto LAB_00108489;
          }
          local_f0.m_b.array_ = a.array_;
          local_f0.m_c = local_118;
          local_f0.m_a = first;
          local_f0.m_d = iVar5;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_b0,&local_f0);
          local_f0.m_a.pos_ = c.pos_;
          local_f0.m_a.array_ = c.array_;
          local_f0.m_b.array_ = last.array_;
          local_f0.m_b.pos_ = last.pos_;
          local_f0.m_c = local_118;
          local_f0.m_d = iVar5;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                      *)stack,&local_f0);
        }
        else {
          if (lVar13 <= n) {
            local_b8 = c.array_;
            local_f0.m_d = helper::lg<long>(n);
            stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                     *)local_b0;
            local_f0.m_a.array_ = local_90;
            local_f0.m_b.array_ = local_b8;
            local_f0.m_b.pos_ = pVar12;
            local_f0.m_c = local_118 + 1;
            local_f0.m_a.pos_ = (pos_type)pBVar10;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_b0,&local_f0);
            local_f0.m_a.pos_ = c.pos_;
            local_f0.m_a.array_ = c.array_;
            local_f0.m_b.array_ = last.array_;
            local_f0.m_b.pos_ = last.pos_;
            local_f0.m_c = local_118;
            local_f0.m_d = iVar5;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                        *)stack,&local_f0);
            last.array_ = a.array_;
            last.pos_ = a.pos_;
            pVar12 = local_c0;
            goto LAB_00108489;
          }
          if (lVar9 <= n) {
            local_f0.m_a.array_ = c.array_;
            local_f0.m_a.pos_ = c.pos_;
            local_f0.m_b.array_ = last.array_;
            local_f0.m_b.pos_ = last.pos_;
            local_f0.m_c = local_118;
            local_f0.m_d = iVar5;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_b0,&local_f0);
            pVar12 = c.pos_;
            pBVar17 = c.array_;
            pBVar10 = local_b8;
            local_f0.m_d = helper::lg<long>(c.pos_ - (long)local_b8);
            local_f0.m_a.pos_ = (pos_type)pBVar10;
            local_f0.m_a.array_ = local_90;
            local_f0.m_b.array_ = pBVar17;
            local_f0.m_b.pos_ = pVar12;
            local_f0.m_c = local_118 + 1;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                        *)stack,&local_f0);
            last.array_ = a.array_;
            last.pos_ = a.pos_;
            pVar12 = local_c0;
            goto LAB_00108489;
          }
          local_f0.m_a.pos_ = c.pos_;
          local_f0.m_a.array_ = c.array_;
          local_f0.m_b.array_ = last.array_;
          local_f0.m_b.pos_ = last.pos_;
          local_f0.m_c = local_118;
          local_f0.m_d = iVar5;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_b0,&local_f0);
          local_f0.m_b.array_ = a.array_;
          local_f0.m_b.pos_ = a.pos_;
          local_f0.m_c = local_118;
          local_f0.m_a = first;
          local_f0.m_d = iVar5;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                      *)stack,&local_f0);
        }
        last.pos_ = c.pos_;
        last.array_ = c.array_;
        pBVar10 = local_b8;
        local_118 = local_118 + 1;
        iVar4 = helper::lg<long>(c.pos_ - (long)local_b8);
        first.pos_ = (pos_type)pBVar10;
        first.array_ = local_90;
        pVar12 = local_c0;
        goto LAB_00108489;
      }
      iVar5 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,pVar14);
      iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar8,CONCAT44(extraout_var_11,iVar5) + pVar12);
      cVar11 = pcVar1[CONCAT44(extraout_var_12,iVar5) + -1];
      iVar5 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,pVar14);
      iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar8,CONCAT44(extraout_var_13,iVar5) + pVar12);
      pVar12 = local_c0;
      if (cVar11 < pcVar1[CONCAT44(extraout_var_14,iVar5)]) {
        last_04.pos_ = last.pos_;
        last_04.array_ = last.array_;
        PA_02.pos_ = local_c0;
        PA_02.array_ = pBVar8;
        first = partition<bitmap::BitmapArray<long>::iterator>(PA_02,first,last_04,local_118);
        iVar4 = helper::lg<long>(last.pos_ - first.pos_);
      }
      local_118 = local_118 + 1;
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
               *)local_b0;
      goto LAB_00108489;
    }
    a.pos_ = pVar14 + 1;
    a.array_ = pBVar10;
    iVar4 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,pVar14);
    iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar8,CONCAT44(extraout_var_05,iVar4) + pVar12);
    cVar11 = pcVar1[CONCAT44(extraout_var_06,iVar4)];
    pVar12 = a.pos_;
    while( true ) {
      if (last.pos_ <= pVar12) break;
      iVar4 = (*((a.array_)->super_Bitmap)._vptr_Bitmap[5])();
      iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar8,CONCAT44(extraout_var_07,iVar4) + local_c0);
      cVar2 = cVar11;
      iVar15 = first;
      if ((pcVar1[CONCAT44(extraout_var_08,iVar4)] != cVar11) &&
         (cVar2 = pcVar1[CONCAT44(extraout_var_08,iVar4)], iVar15 = a,
         1 < (long)(a.pos_ - first.pos_))) break;
      first = iVar15;
      cVar11 = cVar2;
      pVar12 = a.pos_ + 1;
      a.pos_ = pVar12;
    }
    iVar4 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
    pVar12 = local_c0;
    iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar8,CONCAT44(extraout_var_09,iVar4) + local_c0);
    if (pcVar1[CONCAT44(extraout_var_10,iVar4) + -1] < cVar11) {
      iVar15.pos_ = pVar12;
      iVar15.array_ = pBVar8;
      first = partition<bitmap::BitmapArray<long>::iterator>(iVar15,first,a,local_118);
    }
    stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
             *)local_b0;
    pVar12 = a.pos_;
    lVar9 = a.pos_ - first.pos_;
    pBVar10 = a.array_;
    if ((long)(last.pos_ - a.pos_) < lVar9) {
      if ((long)(last.pos_ - a.pos_) < 2) {
        last.array_ = a.array_;
        last.pos_ = a.pos_;
        local_118 = local_118 + 1;
        iVar4 = helper::lg<long>(lVar9);
        pVar12 = local_c0;
      }
      else {
        local_f0.m_d = helper::lg<long>(lVar9);
        stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                 *)local_b0;
        local_f0.m_b.array_ = pBVar10;
        local_f0.m_b.pos_ = pVar12;
        local_f0.m_a = first;
        local_f0.m_c = local_118 + 1;
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
        ::
        emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                  (local_b0,&local_f0);
LAB_00108963:
        first.pos_ = a.pos_;
        first.array_ = a.array_;
        pVar12 = local_c0;
        iVar4 = -1;
      }
    }
    else {
      if (lVar9 < 2) goto LAB_00108963;
      local_f0.m_a = a;
      local_f0.m_b.array_ = last.array_;
      local_f0.m_b.pos_ = last.pos_;
      local_f0.m_c = local_118;
      local_f0.m_d = -1;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
      ::
      emplace_back<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                (local_b0,&local_f0);
      last.array_ = a.array_;
      last.pos_ = a.pos_;
      local_118 = local_118 + 1;
      iVar4 = helper::lg<long>(a.pos_ - first.pos_);
      pVar12 = local_c0;
    }
  } while( true );
}

Assistant:

void mintrosort(
    stack_type &stack, const StringIterator_type T, const SAIterator_type PA,
    SAIterator_type first, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  typedef substring_wrapper<StringIterator_type, SAIterator_type> wrapper_type;
  typedef typename stack_type::value_type stackinfo_type;

  SAIterator_type a, b, c;
  value_type v, x;
  int limit;

  for (limit = helper::lg(last - first);;) {

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        insertionsort(T, PA, first, last, depth);
      }
      STACK_POP4(first, last, depth, limit);
      continue;
    }

    const StringIterator_type Td = T + depth;
    if (limit-- == 0) {
      helper::heapsort(wrapper_type(Td, PA), first, last - first);
    }
    if (limit < 0) {
      for (a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if ((x = Td[PA[*a]]) != v) {
          if (1 < (a - first)) {
            break;
          }
          v = x;
          first = a;
        }
      }
      if (Td[PA[*first] - 1] < v) {
        first = partition(PA, first, a, depth);
      }
      if ((a - first) <= (last - a)) {
        if (1 < (a - first)) {
          STACK_PUSH4(a, last, depth, -1);
          last = a, depth += 1, limit = helper::lg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if (1 < (last - a)) {
          STACK_PUSH4(first, a, depth + 1, helper::lg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = helper::lg(a - first);
        }
      }
      continue;
    }

    /* partition */
    a = helper::pivot(wrapper_type(Td, PA), first, last);
    std::iter_swap(first, a);
    if (helper::partition(wrapper_type(Td, PA), first, first + 1, last, a, c,
                          Td[PA[*first]]) != false) {
      b = (Td[PA[*a]] <= Td[PA[*a] - 1]) ? a : partition(PA, a, c, depth);

      if ((a - first) <= (last - c)) {
        if ((last - c) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(c, last, depth, limit);
          last = a;
        } else if ((a - first) <= (c - b)) {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          last = a;
        } else {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      } else {
        if ((a - first) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(first, a, depth, limit);
          first = c;
        } else if ((last - c) <= (c - b)) {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          first = c;
        } else {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      }
    } else {
      limit += 1;
      if (Td[PA[*first] - 1] < Td[PA[*first]]) {
        first = partition(PA, first, last, depth);
        limit = helper::lg(last - first);
      }
      depth += 1;
    }
  }
}